

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

int __thiscall ktx::OptionsMultiInSingleOut::init(OptionsMultiInSingleOut *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *pOVar2;
  allocator<char> local_252;
  allocator<char> local_251;
  allocator<char> local_250;
  allocator<char> local_24f;
  allocator<char> local_24e;
  allocator<char> local_24d;
  allocator<char> local_24c;
  allocator<char> local_24b;
  allocator<char> local_24a;
  allocator<char> local_249;
  element_type *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_240;
  shared_ptr<const_cxxopts::Value> local_238;
  undefined1 local_220 [40];
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  shared_ptr<const_cxxopts::Value> local_1e8;
  shared_ptr<const_cxxopts::Value> local_1d8;
  element_type *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1c0 [2];
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_249);
  cxxopts::Options::add_options((OptionAdder *)local_220,(Options *)ctx,&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"stdin",&local_24a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "Use stdin as the first input file. (Using a single dash \'-\' as the first input file has the same effect)"
             ,&local_24b);
  cxxopts::value<bool>();
  local_238.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
  local_238.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_1c0[0]._M_pi;
  local_1c8 = (element_type *)0x0;
  a_Stack_1c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_24c);
  pOVar2 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_220,&local_90,&local_b0,&local_238,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"stdout",&local_24d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "Use stdout as the output file. (Using a single dash \'-\' as the output file has the same effect)"
             ,&local_24e);
  cxxopts::value<bool>();
  local_1d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_248;
  local_1d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_240._M_pi;
  local_248 = (element_type *)0x0;
  _Stack_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_24f);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_f0,&local_110,&local_1d8,&local_130);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"files",&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,
             "Input/output files. Last file specified will be used as output. Using a single dash \'-\' as an input or output file will use stdin/stdout."
             ,&local_251);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_1e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1f8;
  local_1e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1f0._M_pi;
  local_1f8 = (element_type *)0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"<filepath>",&local_252);
  cxxopts::OptionAdder::operator()(pOVar2,&local_150,&local_170,&local_1e8,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_240);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1c0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_220 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"files",(allocator<char> *)local_220);
  cxxopts::Options::parse_positional((Options *)ctx,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"<input-file...> <output-file>",(allocator<char> *)local_220);
  std::__cxx11::string::operator=((string *)(ctx + 0x60),local_50);
  iVar1 = std::__cxx11::string::~string(local_50);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("stdin", "Use stdin as the first input file. (Using a single dash '-' as the first input file has the same effect)")
                ("stdout", "Use stdout as the output file. (Using a single dash '-' as the output file has the same effect)")
                ("files", "Input/output files. Last file specified will be used as output."
                          " Using a single dash '-' as an input or output file will use stdin/stdout.", cxxopts::value<std::vector<std::string>>(), "<filepath>");
        opts.parse_positional("files");
        opts.positional_help("<input-file...> <output-file>");
    }